

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::Diffusion
          (Diffusion *this,Amr *Parent,NavierStokesBase *Caller,Diffusion *Coarser,int num_state,
          FluxRegister *Viscflux_reg,Vector<int,_std::allocator<int>_> *_is_diffusive)

{
  pointer piVar1;
  Diffusion *pDVar2;
  pointer pIVar3;
  pointer piVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  allocator local_e1;
  string local_e0;
  ParmParse ppdiff;
  ParmParse pp;
  
  this->parent = Parent;
  this->navier_stokes = Caller;
  this->grids = &(Caller->super_AmrLevel).grids;
  this->dmap = &(Caller->super_AmrLevel).dmap;
  uVar6 = (Caller->super_AmrLevel).level;
  this->level = uVar6;
  this->coarser = Coarser;
  this->finer = (Diffusion *)0x0;
  this->NUM_STATE = num_state;
  (this->crse_ratio).vect[0] = 0;
  (this->crse_ratio).vect[1] = 0;
  (this->crse_ratio).vect[2] = 0;
  this->viscflux_reg = Viscflux_reg;
  if ((anonymous_namespace)::initialized == '\0') {
    verbose = 0;
    visc_tol = 1e-10;
    scale_abec = 0;
    do_reflux = 1;
    max_order = 2;
    tensor_max_order = max_order;
    std::__cxx11::string::string((string *)&pp,"diffuse",(allocator *)&local_e0);
    amrex::ParmParse::ParmParse(&ppdiff,(string *)&pp);
    std::__cxx11::string::~string((string *)&pp);
    amrex::ParmParse::query(&ppdiff,"v",&verbose,0);
    amrex::ParmParse::query(&ppdiff,"scale_abec",&scale_abec,0);
    amrex::ParmParse::query(&ppdiff,"max_order",&max_order,0);
    amrex::ParmParse::query(&ppdiff,"tensor_max_order",&tensor_max_order,0);
    amrex::ParmParse::query(&ppdiff,"agglomeration",&(anonymous_namespace)::agglomeration,0);
    amrex::ParmParse::query(&ppdiff,"consolidation",&(anonymous_namespace)::consolidation,0);
    amrex::ParmParse::query(&ppdiff,"max_fmg_iter",&(anonymous_namespace)::max_fmg_iter,0);
    std::__cxx11::string::string((string *)&local_e0,"ns",&local_e1);
    amrex::ParmParse::ParmParse(&pp,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    amrex::ParmParse::query(&pp,"visc_tol",&visc_tol,0);
    amrex::ParmParse::query(&pp,"do_reflux",&do_reflux,0);
    do_reflux = (int)(do_reflux != 0);
    iVar5 = this->NUM_STATE;
    if ((int)((ulong)((long)(_is_diffusive->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(_is_diffusive->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < iVar5) {
      amrex::Abort_host("Diffusion::Diffusion(): is_diffusive array is not long enough");
      iVar5 = this->NUM_STATE;
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&is_diffusive.super_vector<int,_std::allocator<int>_>,(long)iVar5);
    piVar4 = is_diffusive.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar1 = (_is_diffusive->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = 0; lVar7 < this->NUM_STATE; lVar7 = lVar7 + 1) {
      piVar4[lVar7] = piVar1[lVar7];
    }
    echo_settings(this);
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x35978b);
    (anonymous_namespace)::initialized = '\x01';
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pp);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ppdiff);
    uVar6 = this->level;
  }
  if (0 < (int)uVar6) {
    pDVar2 = this->coarser;
    pIVar3 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = *(int *)((long)(pIVar3 + (ulong)uVar6 + 0xffffffffffffffff) + 8);
    *(undefined8 *)(this->crse_ratio).vect =
         *(undefined8 *)pIVar3[(ulong)uVar6 + 0xffffffffffffffff].vect;
    (this->crse_ratio).vect[2] = iVar5;
    pDVar2->finer = this;
  }
  return;
}

Assistant:

Diffusion::Diffusion (Amr*               Parent,
                      NavierStokesBase*  Caller,
                      Diffusion*         Coarser,
                      int                num_state,
                      FluxRegister*      Viscflux_reg,
                      const Vector<int>&  _is_diffusive)
    :
    parent(Parent),
    navier_stokes(Caller),
    grids(navier_stokes->boxArray()),
    dmap(navier_stokes->DistributionMap()),
    level(navier_stokes->Level()),
    coarser(Coarser),
    finer(0),
    NUM_STATE(num_state),
    viscflux_reg(Viscflux_reg)

{
    if (!initialized)
    {
        //
        // Set defaults here!!!
        //
        Diffusion::verbose             = 0;
        Diffusion::visc_tol            = 1.0e-10;
        Diffusion::do_reflux           = 1;
        Diffusion::scale_abec          = 0;
        //
        // It is essential that we set max_order of the solver to 2
        // if we want to use the standard sol(i)-sol(i-1) approximation
        // for the gradient at Dirichlet boundaries.
        // The solver's default order is 3 and this uses three points for the
        // gradient at a Dirichlet boundary.
        //
        Diffusion::max_order           = 2;
        Diffusion::tensor_max_order    = 2;

        ParmParse ppdiff("diffuse");

        ppdiff.query("v",                   verbose);
        ppdiff.query("scale_abec",          scale_abec);
        ppdiff.query("max_order",           max_order);
        ppdiff.query("tensor_max_order",    tensor_max_order);

        ppdiff.query("agglomeration", agglomeration);
        ppdiff.query("consolidation", consolidation);
        ppdiff.query("max_fmg_iter", max_fmg_iter);
#ifdef AMREX_USE_HYPRE
        ppdiff.query("use_hypre", use_hypre);
        ppdiff.query("hypre_verbose", hypre_verbose);
#endif

        ParmParse pp("ns");

        pp.query("visc_tol",  visc_tol);
        pp.query("do_reflux", do_reflux);

        do_reflux = (do_reflux ? 1 : 0);

        const int n_diff = _is_diffusive.size();

        if (n_diff < NUM_STATE)
            amrex::Abort("Diffusion::Diffusion(): is_diffusive array is not long enough");

        is_diffusive.resize(NUM_STATE);

        for (int i = 0; i < NUM_STATE; i++)
        {
            is_diffusive[i] = _is_diffusive[i];
        }

        echo_settings();

        amrex::ExecOnFinalize(Diffusion::Finalize);

        initialized = true;
    }

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
        coarser->finer = this;
    }
}